

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

void __thiscall
Js::CustomExternalWrapperObject::Mark(CustomExternalWrapperObject *this,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  CustomExternalWrapperType *this_00;
  JsTraceCallback p_Var3;
  undefined4 *puVar4;
  void *pvVar5;
  JsTraceCallback traceCallback;
  Recycler *recycler_local;
  CustomExternalWrapperObject *this_local;
  
  Memory::Recycler::SetNeedExternalWrapperTracing(recycler);
  this_00 = GetExternalType(this);
  p_Var3 = CustomExternalWrapperType::GetJsTraceCallback(this_00);
  if (p_Var3 == (JsTraceCallback)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                ,0xd2,"(nullptr != traceCallback)","nullptr != traceCallback");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pvVar5 = GetSlotData(this);
  (*p_Var3)(pvVar5);
  return;
}

Assistant:

void CustomExternalWrapperObject::Mark(Recycler * recycler)
{
    recycler->SetNeedExternalWrapperTracing();
    JsTraceCallback traceCallback = this->GetExternalType()->GetJsTraceCallback();
    Assert(nullptr != traceCallback);
    traceCallback(this->GetSlotData());
}